

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O1

void __thiscall minibag::Recorder::stopWriting(Recorder *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((char)miniros::console::g_initialized == '\0') {
    miniros::console::initialize();
  }
  if (stopWriting::loc.initialized_ == false) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"miniros.unknown_package","")
    ;
    miniros::console::initializeLogLocation(&stopWriting::loc,(string *)local_38,Info);
    stopWriting();
  }
  if (stopWriting::loc.level_ != Info) {
    stopWriting();
  }
  if (stopWriting::loc.logger_enabled_ == true) {
    stopWriting(this);
  }
  minibag::Bag::close();
  rename((this->write_filename_)._M_dataplus._M_p,(this->target_filename_)._M_dataplus._M_p);
  return;
}

Assistant:

void Recorder::stopWriting()
{
  MINIROS_INFO("Closing %s.", target_filename_.c_str());
  bag_.close();
  rename(write_filename_.c_str(), target_filename_.c_str());
}